

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.h
# Opt level: O2

shared_ptr<cppcms::application_specific_pool> __thiscall
cppcms::create_pool<sender,pools*>(cppcms *this,pools *p)

{
  simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppcms::application_specific_pool> sVar1;
  _Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)> local_28;
  
  this_00 = (simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
             *)operator_new(0x30);
  local_28._M_f = details::create_app<sender,pools*>;
  local_28._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_pools_*>.
  super__Tuple_impl<1UL,_pools_*>.super__Head_base<1UL,_pools_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_pools_*>)
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_pools_*>)p;
  details::
  simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
  ::simple_application_specific_pool1(this_00,&local_28);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::details::simple_application_specific_pool1<sender,std::_Bind<sender*(*(std::_Placeholder<1>,pools*))(cppcms::service&,pools*)>>,void>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)this,
             this_00);
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::application_specific_pool>)
         sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<application_specific_pool> create_pool(P...p)
	{
        auto functor = std::bind(&details::create_app<T,P...>,std::placeholders::_1,p...);
        typedef details::simple_application_specific_pool1<T,decltype(functor)> pool_type;
		booster::shared_ptr<application_specific_pool> f(new pool_type(std::move(functor)));
		return f;
	}